

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O3

int Saig_ManDemiterCheckPo(Aig_Man_t *p,Aig_Obj_t *pObj,Aig_Obj_t **ppPo0,Aig_Obj_t **ppPo1)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  Aig_Obj_t *pAVar4;
  uint uVar5;
  uint uVar6;
  Aig_Obj_t *pObj1;
  Aig_Obj_t *pObj0;
  Aig_Obj_t *local_30;
  Aig_Obj_t *local_28;
  
  if (((*(uint *)&pObj->field_0x18 & 7) != 3) || (p->nTruePos <= (pObj->field_0).CioId)) {
    __assert_fail("Saig_ObjIsPo(p, pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigMiter.c"
                  ,0x250,
                  "int Saig_ManDemiterCheckPo(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t **, Aig_Obj_t **)"
                 );
  }
  pAVar4 = (Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
  uVar5 = (uint)*(undefined8 *)&pAVar4->field_0x18;
  if ((uVar5 & 7) == 1) {
    if (((ulong)pObj->pFanin0 & 1) == 0) {
      return 0;
    }
    *ppPo0 = (Aig_Obj_t *)((ulong)p->pConst1 ^ 1);
    pAVar4 = (Aig_Obj_t *)((ulong)p->pConst1 ^ 1);
    goto LAB_006ebd1b;
  }
  if ((uVar5 & 7) - 7 < 0xfffffffe) {
    return 0;
  }
  iVar3 = Aig_ObjRecognizeExor(pAVar4,&local_28,&local_30);
  if (iVar3 == 0) {
    return 0;
  }
  pAVar4 = (Aig_Obj_t *)((ulong)local_28 ^ 1);
  if (((ulong)pObj->pFanin0 & 1) == 0) {
    pAVar4 = local_28;
  }
  uVar1 = *(ulong *)(((ulong)pAVar4 & 0xfffffffffffffffe) + 0x18);
  uVar5 = (uint)uVar1 & 0x30;
  if (uVar5 == 0x30) {
    return 0;
  }
  uVar2 = *(ulong *)(((ulong)local_30 & 0xfffffffffffffffe) + 0x18);
  uVar6 = (uint)uVar2;
  if ((~uVar6 & 0x30) == 0) {
    return 0;
  }
  if ((uVar5 & uVar6) != 0) {
    return 0;
  }
  if ((uVar2 & 0x10) == 0) {
    if ((uVar1 & 0x10) == 0) {
LAB_006ebdb7:
      if (*(int *)(((ulong)local_30 & 0xfffffffffffffffe) + 0x24) <=
          *(int *)(((ulong)pAVar4 & 0xfffffffffffffffe) + 0x24)) goto LAB_006ebdca;
    }
    *ppPo0 = pAVar4;
    pAVar4 = local_30;
  }
  else {
    if ((uVar1 & 0x10) != 0) goto LAB_006ebdb7;
LAB_006ebdca:
    *ppPo0 = local_30;
  }
LAB_006ebd1b:
  *ppPo1 = pAVar4;
  return 1;
}

Assistant:

int Saig_ManDemiterCheckPo( Aig_Man_t * p, Aig_Obj_t * pObj, Aig_Obj_t ** ppPo0, Aig_Obj_t ** ppPo1 )
{
    Aig_Obj_t * pFanin, * pObj0, * pObj1, * pObjR0, * pObjR1;
    assert( Saig_ObjIsPo(p, pObj) );
    pFanin = Aig_ObjFanin0( pObj );
    if ( Aig_ObjIsConst1(pFanin) )
    {
        if ( !Aig_ObjFaninC0(pObj) )
            return 0;
        *ppPo0 = Aig_ManConst0(p);
        *ppPo1 = Aig_ManConst0(p);
        return 1;
    }
    if ( !Aig_ObjIsNode(pFanin) )
        return 0;
    if ( !Aig_ObjRecognizeExor( pFanin, &pObj0, &pObj1 ) )
        return 0;
    if ( Aig_ObjFaninC0(pObj) )
        pObj0 = Aig_Not(pObj0);
    // make sure they can reach only one
    pObjR0 = Aig_Regular(pObj0);
    pObjR1 = Aig_Regular(pObj1);
    if ( (pObjR0->fMarkA && pObjR0->fMarkB) || (pObjR1->fMarkA && pObjR1->fMarkB) || 
         (pObjR0->fMarkA && pObjR1->fMarkA) || (pObjR0->fMarkB && pObjR1->fMarkB) )
         return 0;

    if ( pObjR1->fMarkA && !pObjR0->fMarkA )
    {
        *ppPo0 = pObj1;
        *ppPo1 = pObj0;
    }
    else if ( pObjR0->fMarkA && !pObjR1->fMarkA )
    {
        *ppPo0 = pObj0;
        *ppPo1 = pObj1;
    }
    else
    {
/*
printf( "%d", pObjR0->fMarkA );
printf( "%d", pObjR0->fMarkB );
printf( ":" );
printf( "%d", pObjR1->fMarkA );
printf( "%d", pObjR1->fMarkB );
printf( "   " );
*/
        if ( Aig_Regular(pObj0)->Id < Aig_Regular(pObj1)->Id )
        {
            *ppPo0 = pObj0;
            *ppPo1 = pObj1;
        }
        else
        {
            *ppPo0 = pObj1;
            *ppPo1 = pObj0;
        }
    }
    return 1;
}